

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O2

void __thiscall
FastLinearExpert::FastLinearExpert(FastLinearExpert *this,int d,int D,Z *z,X *x,IMLE *_mixture)

{
  X *dst;
  X *this_00;
  ZZ *this_01;
  Z *a;
  IMLE *pIVar1;
  Scalar SVar2;
  Scalar SVar3;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_02;
  long newSize;
  long newSize_00;
  double dVar4;
  Z Sigma0;
  Z SZ;
  void *local_a8;
  double local_a0;
  void *local_98;
  long local_90;
  ZZ *local_88;
  ResScalar local_80;
  X *local_78;
  undefined1 local_70 [24];
  scalar_constant_op<double> local_58;
  X *local_50;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_48;
  
  (this->super_LinearExpert).d = d;
  (this->super_LinearExpert).D = D;
  (this->super_LinearExpert).dGamma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).dGamma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Nu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Nu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Mu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Mu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_storage.m_rows = 0;
  (this->super_LinearExpert).Lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_storage.m_cols = 0;
  (this->super_LinearExpert).invSigma.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).invSigma.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).invSigma.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).Psi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Psi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).invPsi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).invPsi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sz.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sz.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sxz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sxz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sxz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->super_LinearExpert).Szz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Szz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Szz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->super_LinearExpert).Sxx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sxx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Nu0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Nu0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).pred_x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).pred_x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).pred_z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).pred_z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  local_78 = x;
  memset(&(this->super_LinearExpert).dNewGamma,0,0x88);
  (this->super_LinearExpert).varLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).varLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).varLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).Sigma.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sigma.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sigma.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->super_LinearExpert).PsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).PsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).PsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).LambdaPsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).LambdaPsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).LambdaPsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).p_x_invVar.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).p_x_invVar.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).p_x_invVar.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).recompute = true;
  this_01 = &this->invSzz0;
  (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->invSzz0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->invSzz0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->invSzz0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  this->mixture = _mixture;
  (this->super_LinearExpert).alpha = (_mixture->param).alpha;
  (this->super_LinearExpert).wPsi = (_mixture->param).wPsi;
  dVar4 = (_mixture->param).wNu;
  (this->super_LinearExpert).wNu = dVar4;
  (this->super_LinearExpert).wSigma =
       (double)d + (_mixture->param).wSigma +
       *(double *)(&DAT_001cdf00 + (ulong)(-(uint)(dVar4 == 0.0) & 1) * 8);
  (this->super_LinearExpert).wLambda = (_mixture->param).wLambda;
  a = &(this->super_LinearExpert).Nu0;
  local_88 = &this->invSzz;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(a,z);
  (this->super_LinearExpert).H = 1e-06;
  (this->super_LinearExpert).Sh = 0.0;
  newSize = (long)d;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&(this->super_LinearExpert).Sz.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,newSize);
  newSize_00 = (long)D;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&(this->super_LinearExpert).Sx.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,newSize_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            (&(this->super_LinearExpert).Sxz.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,newSize_00,newSize);
  local_70._8_8_ =
       (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
       .m_rows;
  local_50 = &this->mixture->Psi;
  local_58.m_other = (this->super_LinearExpert).wPsi;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (&(this->super_LinearExpert).Sxx,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_70);
  this_02 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
            Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
                      ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->invSzz,
                       newSize,newSize);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator/=
            (this_02,&(this->super_LinearExpert).wLambda);
  pIVar1 = this->mixture;
  local_50 = &pIVar1->Sigma;
  local_70._8_8_ =
       (pIVar1->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_rows;
  local_58.m_other = (pIVar1->param).wSigma;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_a8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_70);
  local_70._8_8_ = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_a8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator=
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_01,
             (EigenBase<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)local_70);
  local_70._0_8_ = this_01;
  local_70._8_8_ = a;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_98,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_70);
  local_80 = Eigen::internal::
             dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
             ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)a,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_98);
  local_58.m_other = 1.0 / (this->super_LinearExpert).wNu + local_80;
  local_70._8_8_ = local_90;
  local_70._0_8_ = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_98;
  local_48 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_98;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-=
            ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_01,
             (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
              *)local_70);
  SVar2 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_a8);
  this->detInvSzz0 = (1.0 / SVar2) / (local_80 * (this->super_LinearExpert).wNu + 1.0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&(this->super_LinearExpert).Nu,z);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&(this->super_LinearExpert).Mu,local_78);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            (&(this->super_LinearExpert).Lambda.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,newSize_00,newSize);
  local_48 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             (this->super_LinearExpert).wSigma;
  local_58.m_other = local_a0;
  local_70._16_8_ = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_a8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator=
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
             &(this->super_LinearExpert).invSigma,
             (EigenBase<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
              *)local_70);
  local_58.m_other = (this->super_LinearExpert).wSigma;
  local_70._8_8_ = local_a0;
  local_70._0_8_ = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_a8;
  SVar3 = Eigen::
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
          ::prod((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)local_70);
  dVar4 = 1.0 / SVar3;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  (this->super_LinearExpert).sqrtDetInvSigma = dVar4;
  local_58.m_other = 2.0 / (this->super_LinearExpert).wPsi + 1.0;
  local_70._8_8_ =
       (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
       .m_rows;
  local_70._0_8_ = &this->mixture->Psi;
  dst = &(this->super_LinearExpert).Psi;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (dst,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_70);
  this_00 = &(this->super_LinearExpert).invPsi;
  local_70._0_8_ = dst;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (this_00,(CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_70);
  SVar2 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00);
  if (SVar2 < 0.0) {
    dVar4 = sqrt(SVar2);
  }
  else {
    dVar4 = SQRT(SVar2);
  }
  (this->super_LinearExpert).sqrtDetInvPsi = dVar4;
  (this->super_LinearExpert).recompute = true;
  free(local_98);
  free(local_a8);
  return;
}

Assistant:

FAST_LINEAR_EXPERT_base::FastLinearExpert(Z const &z, X const &x, IMLE<d,D,::FastLinearExpert> *_mixture)
#endif
{
    mixture = _mixture;

    alpha = mixture->getParameters().alpha;
    wPsi = mixture->getParameters().wPsi;
    wNu = mixture->getParameters().wNu;
    wSigma = mixture->getParameters().wSigma + d + ((wNu==0) ? 1.0 : 2.0);
    wLambda = mixture->getParameters().wLambda;

    Nu0 = z;


    H = EPSILON;

    Sh = 0.0;
    Sz.setZero(d);
    Sx.setZero(D);
    Sxz.setZero(D,d);
    Sxx = wPsi * mixture->getPsi();
//Sxx = X::Zero(D);
    invSzz.setIdentity(d,d) /= wLambda;
    Z Sigma0 = mixture->getParameters().wSigma*mixture->getSigma();
    invSzz0 = Sigma0.cwiseInverse().asDiagonal();
	// Using Moore-Penrose Rank-1 update
	Z SZ = invSzz0 * Nu0;
	Scal DOT = Nu0.dot(SZ);
	Scal DEN = DOT + 1 / wNu;
	invSzz0 -= (SZ/DEN) * SZ.transpose();

	// Using Determinant Rank-1 update
	detInvSzz0 = 1.0 / Sigma0.prod();
	detInvSzz0 /= (DOT*wNu + 1.0);

    Nu = z;
    Mu = x;
    Lambda.setZero(D,d);
    invSigma = (Sigma0/wSigma).cwiseInverse().asDiagonal();
    sqrtDetInvSigma = sqrt( 1.0 / (Sigma0/wSigma).prod() );

    Psi = mixture->getPsi() / (1.0 + 2.0/wPsi) ;
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());

//    invSzz.setIdentity(d,d) /= EPSILON;
//    invSzz0.setIdentity(d,d) /= this->w0 * this->sigma;
//    detInvSzz0 = 1.0 / pow(this->w0 * this->sigma, d);
//
//    this->Nu = z;
//    this->Mu = x;
//    this->Lambda.setZero(D,d);
//    this->invSSEzz.setZero(d,d);
//
//    this->invSigma.setIdentity(d,d) *=  (this->w0+d+1.0)/(this->w0*this->sigma);
//    this->sqrtDetInvSigma = pow((this->w0+d+1.0)/(this->w0*this->sigma), d/2.0);
//
//    this->recompute = true;
    recompute = true;
}